

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O0

void list_store_delete(t_list_store *x,t_floatarg f1,t_floatarg f2)

{
  t_listelem *ptVar1;
  uint offset;
  int iVar2;
  t_listelem *ptVar3;
  t_listelem *vec;
  t_listelem *oldptr;
  int n;
  int index;
  int max;
  int i;
  t_floatarg f2_local;
  t_floatarg f1_local;
  t_list_store *x_local;
  
  offset = (uint)f1;
  oldptr._0_4_ = (int)f2;
  ptVar1 = (x->x_alist).l_vec;
  if (((int)offset < 0) || ((x->x_alist).l_n <= (int)offset)) {
    pd_error(x,"list_store_delete: index %d out of range",(ulong)offset);
  }
  else {
    iVar2 = (x->x_alist).l_n - offset;
    if ((int)oldptr == 0) {
      oldptr._0_4_ = 1;
    }
    else if (((int)oldptr < 0) || (iVar2 < (int)oldptr)) {
      oldptr._0_4_ = iVar2;
    }
    if ((x->x_alist).l_npointer != 0) {
      ptVar3 = (x->x_alist).l_vec;
      for (index = 0; index < (int)oldptr; index = index + 1) {
        if (ptVar3[(long)(int)offset + (long)index].l_a.a_type == A_POINTER) {
          gpointer_unset(ptVar3[(long)(int)offset + (long)index].l_a.a_w.w_gpointer);
          (x->x_alist).l_npointer = (x->x_alist).l_npointer + -1;
        }
      }
    }
    memmove((x->x_alist).l_vec + (int)offset,
            (x->x_alist).l_vec + (long)(int)offset + (long)(int)oldptr,
            (long)(int)((x->x_alist).l_n - offset) * 0x28);
    ptVar3 = (t_listelem *)
             resizebytes((x->x_alist).l_vec,(long)(x->x_alist).l_n * 0x28,
                         (long)((x->x_alist).l_n - (int)oldptr) * 0x28);
    (x->x_alist).l_vec = ptVar3;
    if (ptVar3 == (t_listelem *)0x0) {
      (x->x_alist).l_n = 0;
      pd_error((void *)0x0,"list: out of memory");
    }
    else {
      if ((x->x_alist).l_npointer != 0) {
        if ((x->x_alist).l_vec == ptVar1) {
          alist_restore_gpointers(&x->x_alist,offset,((x->x_alist).l_n - offset) - (int)oldptr);
        }
        else {
          alist_restore_gpointers(&x->x_alist,0,(x->x_alist).l_n - (int)oldptr);
        }
      }
      (x->x_alist).l_n = (x->x_alist).l_n - (int)oldptr;
    }
  }
  return;
}

Assistant:

static void list_store_delete(t_list_store *x, t_floatarg f1, t_floatarg f2)
{
    int i, max, index = (int)f1, n = (int)f2;
    t_listelem *oldptr = x->x_alist.l_vec;
    if (index < 0 || index >= x->x_alist.l_n)
    {
        pd_error(x, "list_store_delete: index %d out of range", index);
        return;
    }
    max = x->x_alist.l_n - index;
    if (!n)
        n = 1; /* default */
    else if (n < 0 || n > max)
        n = max; /* till the end of the list */

        /* unset pointers for elements which are to be deleted */
    if (x->x_alist.l_npointer)
    {
        t_listelem *vec = x->x_alist.l_vec + index;
        for (i = 0; i < n; i++)
        {
            if (vec[i].l_a.a_type == A_POINTER)
            {
                gpointer_unset(vec[i].l_a.a_w.w_gpointer);
                x->x_alist.l_npointer--;
            }
        }
    }
        /* shift elements (after the deleted elements) to the left */
    memmove(x->x_alist.l_vec + index, x->x_alist.l_vec + index + n,
        (x->x_alist.l_n - index) * sizeof(*x->x_alist.l_vec));
        /* shrink memory */
    if (!(x->x_alist.l_vec = (t_listelem *)resizebytes(x->x_alist.l_vec,
        (x->x_alist.l_n) * sizeof(*x->x_alist.l_vec),
        (x->x_alist.l_n - n) * sizeof(*x->x_alist.l_vec))))
    {
        x->x_alist.l_n = 0;
        pd_error(0, "list: out of memory");
        return;
    }
    if (x->x_alist.l_npointer)
    {
            /* fix all gpointers in case resizebytes() has moved the alist in memory */
        if (x->x_alist.l_vec != oldptr)
            alist_restore_gpointers(&x->x_alist, 0, x->x_alist.l_n - n);
        else /* only fix gpointers after index (because of of memmove()) */
            alist_restore_gpointers(&x->x_alist, index, x->x_alist.l_n - index - n);
    }
    x->x_alist.l_n -= n;
}